

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockmodel.cpp
# Opt level: O2

void __thiscall
blockmodel_t::apply_mcmc_moves
          (blockmodel_t *this,vector<mcmc_move_t,_std::allocator<mcmc_move_t>_> *moves)

{
  int *piVar1;
  pointer pvVar2;
  pointer piVar3;
  reference pvVar4;
  _Base_ptr p_Var5;
  pointer pmVar6;
  uint uVar7;
  ulong uVar8;
  
  pmVar6 = (moves->super__Vector_base<mcmc_move_t,_std::allocator<mcmc_move_t>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  while( true ) {
    uVar8 = (ulong)uVar7;
    if ((ulong)(((long)(moves->super__Vector_base<mcmc_move_t,_std::allocator<mcmc_move_t>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pmVar6) / 0xc) <= uVar8)
    break;
    pvVar4 = std::
             vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::at(this->adj_list_ptr_,(ulong)pmVar6[uVar8].vertex);
    p_Var5 = (pvVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    pmVar6 = (moves->super__Vector_base<mcmc_move_t,_std::allocator<mcmc_move_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
    while( true ) {
      pvVar4 = std::
               vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ::at(this->adj_list_ptr_,(ulong)pmVar6[uVar8].vertex);
      if ((_Rb_tree_header *)p_Var5 == &(pvVar4->_M_t)._M_impl.super__Rb_tree_header) break;
      pvVar2 = (this->k_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pmVar6 = (moves->super__Vector_base<mcmc_move_t,_std::allocator<mcmc_move_t>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = (int *)(*(long *)&pvVar2[p_Var5[1]._M_color].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + (ulong)pmVar6[uVar8].source * 4);
      *piVar1 = *piVar1 + -1;
      piVar1 = (int *)(*(long *)&pvVar2[p_Var5[1]._M_color].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + (ulong)pmVar6[uVar8].target * 4);
      *piVar1 = *piVar1 + 1;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    }
    pmVar6 = (moves->super__Vector_base<mcmc_move_t,_std::allocator<mcmc_move_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->n_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = piVar3 + pmVar6[uVar8].source;
    *piVar1 = *piVar1 + -1;
    piVar1 = piVar3 + pmVar6[uVar8].target;
    *piVar1 = *piVar1 + 1;
    (this->memberships_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[pmVar6[uVar8].vertex] = pmVar6[uVar8].target;
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void blockmodel_t::apply_mcmc_moves(std::vector<mcmc_move_t> moves)
{
  for (unsigned int i = 0; i < moves.size(); ++i)
  {
        // Change block degrees and block sizes
    for (auto neighbour = adj_list_ptr_->at(moves[i].vertex).begin();
     neighbour != adj_list_ptr_->at(moves[i].vertex).end();
     ++neighbour)
    {
      --k_[*neighbour][moves[i].source];
      ++k_[*neighbour][moves[i].target];
    }
    --n_[moves[i].source];
    ++n_[moves[i].target];
        // Set new memberships
    memberships_[moves[i].vertex] = moves[i].target;
  }
}